

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func.cpp
# Opt level: O0

double lognchoosek(int nn,int k)

{
  int in_ESI;
  __type_conflict _Var1;
  __type_conflict _Var2;
  int i;
  double s;
  undefined4 local_14;
  undefined8 local_10;
  
  local_10 = 0.0;
  for (local_14 = 1; local_14 <= in_ESI; local_14 = local_14 + 1) {
    _Var1 = std::log<int>(0);
    _Var2 = std::log<int>(0);
    local_10 = (local_10 + _Var1) - _Var2;
  }
  return local_10;
}

Assistant:

double lognchoosek(int nn, int k)
{
    double s=0;
    for (int i=1; i<=k; i++) s = s + log(nn-k+i)-log(i);
    return s;
}